

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O3

void PutDword(UINT32 Data)

{
  UINT8 *pUVar1;
  UINT8 *pUVar2;
  UINT8 *pUVar3;
  
  pUVar1 = mDstUpperLimit;
  pUVar3 = mDst;
  if (mDst < mDstUpperLimit) {
    pUVar3 = mDst + 1;
    pUVar2 = pUVar3;
    *mDst = (UINT8)Data;
    mDst = pUVar2;
  }
  pUVar2 = pUVar3;
  if (pUVar3 < pUVar1) {
    pUVar2 = pUVar3 + 1;
    mDst = pUVar2;
    *pUVar3 = (UINT8)(Data >> 8);
  }
  pUVar3 = pUVar2;
  if (pUVar2 < pUVar1) {
    pUVar3 = pUVar2 + 1;
    mDst = pUVar3;
    *pUVar2 = (UINT8)(Data >> 0x10);
  }
  if (pUVar3 < pUVar1) {
    mDst = pUVar3 + 1;
    *pUVar3 = (UINT8)(Data >> 0x18);
  }
  return;
}

Assistant:

STATIC
  VOID
  PutDword (
  UINT32 Data
  )
  /*++

  Routine Description:

  Put a DWORD to output stream

  Arguments:

  Data    - the DWORD to put

  Returns: (VOID)

  --*/
{
  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x08)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x10)) & 0xff);
  }

  if (mDst < mDstUpperLimit) {
    *mDst++ = (UINT8) (((UINT8) (Data >> 0x18)) & 0xff);
  }
}